

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O1

Integer __thiscall nvim::Nvim::win_get_height(Nvim *this,Window window)

{
  Integer res;
  Integer local_50;
  string local_48;
  Window local_28;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_28 = window;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"nvim_win_get_height","");
  NvimRPC::call<long>(&this->client_,&local_48,&local_50,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return local_50;
}

Assistant:

Integer Nvim::win_get_height(Window window) {
    Integer res;
    client_.call("nvim_win_get_height", res, window);
    return res;
}